

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast_node::set_location_range(ast_node *this,YYLTYPE *begin,YYLTYPE *end)

{
  YYLTYPE *end_local;
  YYLTYPE *begin_local;
  ast_node *this_local;
  
  (this->location).path = begin->path;
  (this->location).source = begin->source;
  (this->location).first_line = begin->first_line;
  (this->location).last_line = end->last_line;
  (this->location).first_column = begin->first_column;
  (this->location).last_column = end->last_column;
  return;
}

Assistant:

void set_location_range(const struct YYLTYPE &begin, const struct YYLTYPE &end)
   {
      this->location.path = begin.path;
      this->location.source = begin.source;
      this->location.first_line = begin.first_line;
      this->location.last_line = end.last_line;
      this->location.first_column = begin.first_column;
      this->location.last_column = end.last_column;
   }